

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rf5c68.c
# Opt level: O0

void rf5c68_write_ram(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  rf5c68_state *chip;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *info_local;
  
  if (offset < *(uint *)((long)info + 0x8c)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)info + 0x8c) < offset + length) {
      data_local._0_4_ = *(int *)((long)info + 0x8c) - offset;
    }
    memcpy((void *)(*(long *)((long)info + 0x90) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void rf5c68_write_ram(void *info, UINT32 offset, UINT32 length, const UINT8* data)
{
	rf5c68_state *chip = (rf5c68_state *)info;
	
	// offset is absolute here
	if (offset >= chip->datasize)
		return;
	if (offset + length > chip->datasize)
		length = chip->datasize - offset;
	
	memcpy(chip->data + offset, data, length);
	
	return;
}